

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O3

void __thiscall
autoSimplification_power14_Test::~autoSimplification_power14_Test
          (autoSimplification_power14_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(autoSimplification, power14)
{
    auto const x = symbol("x");
    auto const y = symbol("y");
    auto const z = symbol("z");
    auto const f1o2 = fraction(1, 2);
    auto const n2 = 2_i;
    auto const e = ((((x*y)^f1o2)*(z^n2))^n2);
    EXPECT_EQ(toString(e), "(* x y (^ z 4))");
}